

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.cpp
# Opt level: O1

void insertleaf(cbtDbvt *pdbvt,cbtDbvtNode *root,cbtDbvtNode *leaf)

{
  cbtDbvtNode **ppcVar1;
  cbtDbvtNode *pcVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  cbtDbvtNode *pcVar12;
  long lVar13;
  cbtDbvtNode *pcVar14;
  undefined1 auVar15 [16];
  
  if (pdbvt->m_root == (cbtDbvtNode *)0x0) {
    pdbvt->m_root = leaf;
    leaf->parent = (cbtDbvtNode *)0x0;
  }
  else {
    if ((root->field_2).childs[1] != (cbtDbvtNode *)0x0) {
      fVar3 = (leaf->volume).mi.m_floats[0] + (leaf->volume).mx.m_floats[0];
      fVar4 = (leaf->volume).mi.m_floats[1] + (leaf->volume).mx.m_floats[1];
      fVar5 = (leaf->volume).mi.m_floats[2] + (leaf->volume).mx.m_floats[2];
      auVar15._8_4_ = 0x7fffffff;
      auVar15._0_8_ = 0x7fffffff7fffffff;
      auVar15._12_4_ = 0x7fffffff;
      do {
        pcVar14 = (root->field_2).childs[0];
        pcVar12 = (root->field_2).childs[1];
        auVar6 = vandps_avx(ZEXT416((uint)(fVar3 - ((pcVar14->volume).mi.m_floats[0] +
                                                   (pcVar14->volume).mx.m_floats[0]))),auVar15);
        auVar7 = vandps_avx(ZEXT416((uint)(fVar4 - ((pcVar14->volume).mi.m_floats[1] +
                                                   (pcVar14->volume).mx.m_floats[1]))),auVar15);
        auVar8 = vandps_avx(ZEXT416((uint)(fVar5 - ((pcVar14->volume).mi.m_floats[2] +
                                                   (pcVar14->volume).mx.m_floats[2]))),auVar15);
        auVar9 = vandps_avx(ZEXT416((uint)(fVar3 - ((pcVar12->volume).mi.m_floats[0] +
                                                   (pcVar12->volume).mx.m_floats[0]))),auVar15);
        auVar10 = vandps_avx(ZEXT416((uint)(fVar4 - ((pcVar12->volume).mi.m_floats[1] +
                                                    (pcVar12->volume).mx.m_floats[1]))),auVar15);
        auVar11 = vandps_avx(ZEXT416((uint)(fVar5 - ((pcVar12->volume).mi.m_floats[2] +
                                                    (pcVar12->volume).mx.m_floats[2]))),auVar15);
        root = *(cbtDbvtNode **)
                ((long)(&root->volume + 1) +
                ((ulong)(auVar9._0_4_ + auVar10._0_4_ + auVar11._0_4_ <=
                        auVar6._0_4_ + auVar7._0_4_ + auVar8._0_4_) + 1) * 8);
      } while ((root->field_2).childs[1] != (cbtDbvtNode *)0x0);
    }
    pcVar14 = root->parent;
    pcVar12 = pdbvt->m_free;
    if (pcVar12 == (cbtDbvtNode *)0x0) {
      pcVar12 = (cbtDbvtNode *)cbtAlignedAllocInternal(0x38,0x10);
      (pcVar12->volume).mi.m_floats[0] = 0.0;
      (pcVar12->volume).mi.m_floats[1] = 0.0;
      (pcVar12->volume).mi.m_floats[2] = 0.0;
      (pcVar12->volume).mi.m_floats[3] = 0.0;
      (pcVar12->volume).mx.m_floats[0] = 0.0;
      (pcVar12->volume).mx.m_floats[1] = 0.0;
      (pcVar12->volume).mx.m_floats[2] = 0.0;
      (pcVar12->volume).mx.m_floats[3] = 0.0;
      (pcVar12->volume).mx.m_floats[2] = 0.0;
      (pcVar12->volume).mx.m_floats[3] = 0.0;
      pcVar12->parent = (cbtDbvtNode *)0x0;
      (pcVar12->field_2).childs[0] = (cbtDbvtNode *)0x0;
      (pcVar12->field_2).childs[1] = (cbtDbvtNode *)0x0;
    }
    else {
      pdbvt->m_free = (cbtDbvtNode *)0x0;
    }
    pcVar12->parent = pcVar14;
    (pcVar12->field_2).childs[0] = (cbtDbvtNode *)0x0;
    (pcVar12->field_2).childs[1] = (cbtDbvtNode *)0x0;
    lVar13 = 4;
    do {
      auVar15 = vminss_avx(ZEXT416(*(uint *)((long)(&(leaf->volume).mi + -1) + lVar13 * 4)),
                           ZEXT416(*(uint *)((long)(&(root->volume).mi + -1) + lVar13 * 4)));
      *(int *)((long)(&(pcVar12->volume).mi + -1) + lVar13 * 4) = auVar15._0_4_;
      auVar15 = vmaxss_avx(ZEXT416((uint)(leaf->volume).mi.m_floats[lVar13]),
                           ZEXT416((uint)(root->volume).mi.m_floats[lVar13]));
      (pcVar12->volume).mi.m_floats[lVar13] = auVar15._0_4_;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 7);
    if (pcVar14 == (cbtDbvtNode *)0x0) {
      (pcVar12->field_2).childs[0] = root;
      root->parent = pcVar12;
      (pcVar12->field_2).childs[1] = leaf;
      leaf->parent = pcVar12;
      pdbvt->m_root = pcVar12;
    }
    else {
      *(cbtDbvtNode **)
       ((long)(&pcVar14->volume + 1) + ((ulong)((root->parent->field_2).childs[1] == root) + 1) * 8)
           = pcVar12;
      (pcVar12->field_2).childs[0] = root;
      root->parent = pcVar12;
      (pcVar12->field_2).childs[1] = leaf;
      leaf->parent = pcVar12;
      do {
        if (((((pcVar14->volume).mi.m_floats[0] <= (pcVar12->volume).mi.m_floats[0]) &&
             ((pcVar14->volume).mi.m_floats[1] <= (pcVar12->volume).mi.m_floats[1])) &&
            ((pcVar14->volume).mi.m_floats[2] <= (pcVar12->volume).mi.m_floats[2])) &&
           ((((pcVar12->volume).mx.m_floats[0] <= (pcVar14->volume).mx.m_floats[0] &&
             ((pcVar12->volume).mx.m_floats[1] <= (pcVar14->volume).mx.m_floats[1])) &&
            ((pcVar12->volume).mx.m_floats[2] <= (pcVar14->volume).mx.m_floats[2])))) {
          return;
        }
        pcVar12 = (pcVar14->field_2).childs[0];
        pcVar2 = (pcVar14->field_2).childs[1];
        lVar13 = 4;
        do {
          auVar15 = vminss_avx(ZEXT416(*(uint *)((long)(&(pcVar12->volume).mi + -1) + lVar13 * 4)),
                               ZEXT416(*(uint *)((long)(&(pcVar2->volume).mi + -1) + lVar13 * 4)));
          *(int *)((long)(&(pcVar14->volume).mi + -1) + lVar13 * 4) = auVar15._0_4_;
          auVar15 = vmaxss_avx(ZEXT416((uint)(pcVar12->volume).mi.m_floats[lVar13]),
                               ZEXT416((uint)(pcVar2->volume).mi.m_floats[lVar13]));
          (pcVar14->volume).mi.m_floats[lVar13] = auVar15._0_4_;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 7);
        ppcVar1 = &pcVar14->parent;
        pcVar12 = pcVar14;
        pcVar14 = *ppcVar1;
      } while (*ppcVar1 != (cbtDbvtNode *)0x0);
    }
  }
  return;
}

Assistant:

static void insertleaf(cbtDbvt* pdbvt,
					   cbtDbvtNode* root,
					   cbtDbvtNode* leaf)
{
	if (!pdbvt->m_root)
	{
		pdbvt->m_root = leaf;
		leaf->parent = 0;
	}
	else
	{
		if (!root->isleaf())
		{
			do
			{
				root = root->childs[Select(leaf->volume,
										   root->childs[0]->volume,
										   root->childs[1]->volume)];
			} while (!root->isleaf());
		}
		cbtDbvtNode* prev = root->parent;
		cbtDbvtNode* node = createnode(pdbvt, prev, leaf->volume, root->volume, 0);
		if (prev)
		{
			prev->childs[indexof(root)] = node;
			node->childs[0] = root;
			root->parent = node;
			node->childs[1] = leaf;
			leaf->parent = node;
			do
			{
				if (!prev->volume.Contain(node->volume))
					Merge(prev->childs[0]->volume, prev->childs[1]->volume, prev->volume);
				else
					break;
				node = prev;
			} while (0 != (prev = node->parent));
		}
		else
		{
			node->childs[0] = root;
			root->parent = node;
			node->childs[1] = leaf;
			leaf->parent = node;
			pdbvt->m_root = node;
		}
	}
}